

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrassemblelist.cpp
# Opt level: O0

void * TPZDohrAssembleList<std::complex<double>_>::Assemble(void *voidptr)

{
  undefined1 uVar1;
  int *in_RDI;
  lock_guard<std::mutex> lock;
  TPZAutoPointer<TPZDohrAssembleItem<std::complex<double>_>_> work;
  TPZDohrAssembleList<std::complex<double>_> *myptr;
  mutex_type *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  TPZDohrAssembleItem<std::complex<double>_> *in_stack_ffffffffffffffb0;
  undefined7 in_stack_ffffffffffffffc8;
  TPZFMatrix<std::complex<double>_> *in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffdc;
  TPZDohrAssembly<std::complex<double>_> *in_stack_ffffffffffffffe0;
  TPZAutoPointer<TPZDohrAssembleItem<std::complex<double>_>_> in_stack_ffffffffffffffe8;
  
  while (0 < *in_RDI) {
    PopItem((TPZDohrAssembleList<std::complex<double>_> *)in_stack_ffffffffffffffe8.fRef);
    uVar1 = ::TPZAutoPointer::operator_cast_to_bool((TPZAutoPointer *)&stack0xffffffffffffffe8);
    if ((bool)uVar1) {
      std::lock_guard<std::mutex>::lock_guard
                ((lock_guard<std::mutex> *)
                 CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                 in_stack_ffffffffffffff98);
      TPZAutoPointer<TPZDohrAssembly<std::complex<double>_>_>::operator->
                ((TPZAutoPointer<TPZDohrAssembly<std::complex<double>_>_> *)(in_RDI + 0x34));
      in_stack_ffffffffffffffb0 =
           TPZAutoPointer<TPZDohrAssembleItem<std::complex<double>_>_>::operator->
                     ((TPZAutoPointer<TPZDohrAssembleItem<std::complex<double>_>_> *)
                      &stack0xffffffffffffffe8);
      in_stack_ffffffffffffffa4 = in_stack_ffffffffffffffb0->fSubIndex;
      TPZAutoPointer<TPZDohrAssembleItem<std::complex<double>_>_>::operator->
                ((TPZAutoPointer<TPZDohrAssembleItem<std::complex<double>_>_> *)
                 &stack0xffffffffffffffe8);
      TPZDohrAssembly<std::complex<double>_>::Assemble
                (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd0,
                 (TPZFMatrix<std::complex<double>_> *)CONCAT17(uVar1,in_stack_ffffffffffffffc8));
      std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1fc9dae);
    }
    else {
      TPZSemaphore::Wait((TPZSemaphore *)in_stack_ffffffffffffffb0);
    }
    TPZAutoPointer<TPZDohrAssembleItem<std::complex<double>_>_>::~TPZAutoPointer
              ((TPZAutoPointer<TPZDohrAssembleItem<std::complex<double>_>_> *)
               CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  }
  return in_RDI;
}

Assistant:

void *TPZDohrAssembleList<TVar>::Assemble(void *voidptr)
{
	TPZDohrAssembleList *myptr = (TPZDohrAssembleList *) voidptr;
	while (myptr->fNumItems > 0) {
		TPZAutoPointer<TPZDohrAssembleItem<TVar> > work = myptr->PopItem();
		if (work) {
            std::lock_guard<std::mutex> lock(myptr->fAssemblyLock);
			myptr->fAssembleIndexes->Assemble(work->fSubIndex,work->fAssembleData,*(myptr->fOutput));
		}
		else {
			// wait for a signal
			myptr->fSemaphore.Wait();
		}
	}
	return voidptr;
}